

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint * RDL_listFamilies(RDL_data *data,uint object,char mode,char family)

{
  uint uVar1;
  long lVar2;
  void *__ptr;
  void *__ptr_00;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong unaff_R14;
  ulong uVar9;
  ulong local_40;
  code *local_38;
  
  if (1 < (byte)(mode + 0x9fU)) {
    (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_listFamilies()\' with invalid mode \'%c\'\n",
                      0x62);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                  ,0x385,
                  "unsigned int *RDL_listFamilies(const RDL_data *, unsigned int, char, char)");
  }
  if (family == 'u') {
    local_38 = RDL_giveURF;
    lVar2 = 8;
  }
  else {
    if (family != 'r') {
      (*RDL_outputFunc)(RDL_ERROR,
                        "tried to call \'RDL_listFamilies()\' with invalid family \'%c\'\n",family);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                    ,0x396,
                    "unsigned int *RDL_listFamilies(const RDL_data *, unsigned int, char, char)");
    }
    local_38 = RDL_giveRCF;
    lVar2 = 0xc;
  }
  uVar9 = (ulong)*(uint *)((long)&data->graph + lVar2);
  __ptr = malloc(0x100);
  if (uVar9 == 0) {
    uVar6 = 0;
  }
  else {
    uVar8 = 0;
    local_40 = 0x40;
    uVar6 = 0;
    do {
      if (family == 'u') {
        unaff_R14 = uVar8;
      }
      unaff_R14 = unaff_R14 & 0xffffffff;
      if (family == 'r') {
        unaff_R14 = (ulong)data->rcf_to_urf[uVar8][0];
      }
      uVar4 = data->urf_to_bcc[unaff_R14][0];
      if (mode == 'a') {
        uVar5 = (ulong)data->bccGraphs->nof_bcc_per_node[object];
        if (uVar5 != 0) {
          uVar7 = 0;
          do {
            if (data->bccGraphs->node_to_bcc_mapping[object][uVar7 & 0xffffffff] == uVar4)
            goto LAB_0010891e;
            uVar7 = uVar7 + 2;
          } while (uVar5 * 2 != uVar7);
        }
      }
      else if (*data->bccGraphs->edge_to_bcc_mapping[object] == uVar4) {
LAB_0010891e:
        __ptr_00 = (void *)(*local_38)(data,uVar8 & 0xffffffff,(int)mode);
        uVar4 = 0;
        do {
          uVar1 = *(uint *)((long)__ptr_00 + (ulong)uVar4 * 4);
          if (uVar1 == 0xffffffff) break;
          uVar4 = uVar4 + 1;
        } while (uVar1 != object);
        free(__ptr_00);
        if (uVar1 != 0xffffffff) {
          if (uVar6 == (uint)local_40) {
            local_40 = (ulong)((uint)local_40 * 2);
            __ptr = realloc(__ptr,local_40 * 4);
          }
          uVar5 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          *(int *)((long)__ptr + uVar5 * 4) = (int)uVar8;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9);
  }
  puVar3 = (uint *)realloc(__ptr,(ulong)(uVar6 + 1) << 2);
  puVar3[uVar6] = 0xffffffff;
  return puVar3;
}

Assistant:

static unsigned *RDL_listFamilies(const RDL_data *data, unsigned object,
    char mode, char family)
{
  unsigned *result;
  unsigned nof_families;
  unsigned nextfree=0, alloced=RDL_RESERVED_START;
  unsigned *objects;
  unsigned i,j, bcc_index, target_bcc, urf_index;
  char contained, can_be_contained;

  if(!(mode == 'a' || mode == 'b'))
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_listFamilies()' with invalid mode '%c'\n",mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  unsigned* (*giveFamily) (const RDL_data*, unsigned, char) = NULL;

  if (family == 'u') {
    nof_families = data->nofURFs;
    giveFamily = RDL_giveURF;
  }
  else if (family == 'r') {
    nof_families = data->nofRCFs;
    giveFamily = RDL_giveRCF;
  }
  else {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_listFamilies()' with invalid family '%c'\n",family);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  result=malloc(alloced * sizeof(*result));
  for(i = 0; i < nof_families; ++i)
  {
    if (family == 'u') {
      urf_index = i;
    }
    else if (family == 'r') {
      urf_index = data->rcf_to_urf[i][0];
    }

    bcc_index = data->urf_to_bcc[urf_index][0];

    /*
     * check if object belongs to this BCC at all,
     * if not it can't be in the URF either
     */
    can_be_contained = 0;
    if (mode == 'a') {
      for (j = 0; j < data->bccGraphs->nof_bcc_per_node[object]; ++j) {
        target_bcc = data->bccGraphs->node_to_bcc_mapping[object][2*j];
        if (target_bcc == bcc_index) {
          can_be_contained = 1;
          break;
        }
      }
    }
    else {
      target_bcc = data->bccGraphs->edge_to_bcc_mapping[object][0];
      if (target_bcc == bcc_index) {
        can_be_contained = 1;
      }
    }

    contained = 0;
    if (can_be_contained) {
      objects = giveFamily(data, i, mode);
      for(j=0; objects[j]<UINT_MAX; ++j)
      {
        if(objects[j] == object)
        {
          contained = 1;
          break;
        }
      }
      free(objects);
    }
    if (contained) {
      if(nextfree == alloced) {
        alloced *= 2;
        result = realloc(result, alloced*sizeof(*result));
      }
      result[nextfree++] = i;
    }
  }

  result = realloc(result, (nextfree+1)*sizeof(*result));
  result[nextfree] = UINT_MAX;
  return result;
}